

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

bool cli::isDirectory(string *path)

{
  int iVar1;
  char *__file;
  bool local_a1;
  undefined1 local_a0 [8];
  stat sb;
  string *path_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)path;
  __file = (char *)std::__cxx11::string::c_str();
  iVar1 = stat(__file,(stat *)local_a0);
  local_a1 = iVar1 == 0 && ((uint)sb.st_nlink & 0xf000) == 0x4000;
  return local_a1;
}

Assistant:

bool isDirectory(const std::string &path)
	{
#ifdef _WIN32
		DWORD attrib = GetFileAttributesA(path.c_str());
		return (attrib != INVALID_FILE_ATTRIBUTES && (attrib & FILE_ATTRIBUTE_DIRECTORY) == FILE_ATTRIBUTE_DIRECTORY);
#else
		struct stat sb;
		return (stat(path.c_str(), &sb) == 0 && (S_ISDIR(sb.st_mode)));
#endif
	}